

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

uint8_t * sysbvm_jit_installIn
                    (sysbvm_bytecodeJit_t *jit,uint8_t *codeWriteablePointer,
                    uint8_t *codeExecutablePointer)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  uint8_t *debugLineExecutablePointer;
  uint8_t *debugStrExecutablePointer;
  uint8_t *debugAbbrevExecutablePointer;
  uint8_t *debugInfoExecutablePointer;
  uint8_t *__dest;
  uint8_t *objectFileContentExecutablePointer_00;
  uint8_t *objectFileContentExecutablePointer;
  uint8_t *objectFileContentPointer;
  uint8_t *debugInfoZoneExecutablePointer;
  uint8_t *debugInfoZonePointer;
  uint8_t *debugAbbrevZoneExecutablePointer;
  uint8_t *debugAbbrevZonePointer;
  uint8_t *debugStrZoneExecutablePointer;
  uint8_t *debugStrZonePointer;
  uint8_t *debugLineZoneExecutablePointer;
  uint8_t *debugLineZonePointer;
  uint8_t *ehFrameZoneExecutablePointer;
  uint8_t *ehFrameZonePointer;
  uint8_t *unwindInfoZoneExecutablePointer;
  uint8_t *unwindInfoZonePointer;
  intptr_t relativeValue;
  intptr_t relocationTargetAddress;
  uint8_t *relocationExecutableTarget;
  uint8_t *relocationTarget;
  sysbvm_bytecodeJitRelocation_t *relocation;
  size_t i;
  uint8_t *constantZoneExecutablePointer;
  uint8_t *constantZonePointer;
  uint8_t *instructionsExecutablePointers;
  uint8_t *instructionsPointers;
  uint8_t *objectFileHeaderExecutablePointer;
  uint8_t *objectFileHeaderPointer;
  size_t objectFileContentOffset;
  size_t debugInfoOffset;
  size_t debugAbbrevOffset;
  size_t debugStrOffset;
  size_t debugLineOffset;
  size_t ehFrameOffset;
  size_t unwindInfoOffset;
  size_t constantsOffset;
  size_t codeOffset;
  size_t objectFileHeaderOffset;
  uint8_t *codeExecutablePointer_local;
  uint8_t *codeWriteablePointer_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  codeOffset = 0;
  objectFileHeaderOffset = (size_t)codeExecutablePointer;
  codeExecutablePointer_local = codeWriteablePointer;
  codeWriteablePointer_local = (uint8_t *)jit;
  sVar1 = sysbvm_sizeAlignedTo((jit->objectFileHeader).size,0x10);
  constantsOffset = sVar1;
  sVar2 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0x90),0x10);
  unwindInfoOffset = sVar1 + sVar2;
  sVar3 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0xb0),0x10);
  sVar3 = sVar1 + sVar2 + sVar3;
  ehFrameOffset = sVar3;
  sVar1 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0x130),0x10);
  sVar3 = sVar3 + sVar1;
  debugLineOffset = sVar3;
  sVar1 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0x170),0x10);
  sVar3 = sVar3 + sVar1;
  debugStrOffset = sVar3;
  sVar1 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0x288),0x10);
  sVar3 = sVar3 + sVar1;
  debugAbbrevOffset = sVar3;
  sVar1 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0x2a8),0x10);
  sVar3 = sVar3 + sVar1;
  debugInfoOffset = sVar3;
  sVar1 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0x2c8),0x10);
  sVar3 = sVar3 + sVar1;
  objectFileContentOffset = sVar3;
  sVar1 = sysbvm_sizeAlignedTo(*(size_t *)(codeWriteablePointer_local + 0x2e8),0x10);
  objectFileHeaderPointer = (uint8_t *)(sVar3 + sVar1);
  objectFileHeaderExecutablePointer = codeExecutablePointer_local + codeOffset;
  instructionsPointers = (uint8_t *)(objectFileHeaderOffset + codeOffset);
  memcpy(objectFileHeaderExecutablePointer,*(void **)(codeWriteablePointer_local + 0x80),
         *(size_t *)(codeWriteablePointer_local + 0x70));
  instructionsExecutablePointers = codeExecutablePointer_local + constantsOffset;
  constantZonePointer = (uint8_t *)(objectFileHeaderOffset + constantsOffset);
  memcpy(instructionsExecutablePointers,*(void **)(codeWriteablePointer_local + 0xa0),
         *(size_t *)(codeWriteablePointer_local + 0x90));
  constantZoneExecutablePointer = codeExecutablePointer_local + unwindInfoOffset;
  i = objectFileHeaderOffset + unwindInfoOffset;
  memcpy(constantZoneExecutablePointer,*(void **)(codeWriteablePointer_local + 0xc0),
         *(size_t *)(codeWriteablePointer_local + 0xb0));
  for (relocation = (sysbvm_bytecodeJitRelocation_t *)0x0;
      relocation < *(sysbvm_bytecodeJitRelocation_t **)(codeWriteablePointer_local + 0xd0);
      relocation = (sysbvm_bytecodeJitRelocation_t *)((long)&relocation->offset + 1)) {
    relocationTarget =
         (uint8_t *)(*(long *)(codeWriteablePointer_local + 0xe0) + (long)relocation * 0x20);
    relocationExecutableTarget = instructionsExecutablePointers + *(long *)relocationTarget;
    relativeValue = (intptr_t)(constantZonePointer + *(long *)relocationTarget);
    unwindInfoZonePointer =
         (uint8_t *)
         (((i + *(long *)((long)relocationTarget + 0x10)) - relativeValue) +
         *(long *)((long)relocationTarget + 0x18));
    if ((int)*(long *)((long)relocationTarget + 8) == 0) {
      *(int *)relocationExecutableTarget = (int)unwindInfoZonePointer;
    }
    else if ((int)*(long *)((long)relocationTarget + 8) == 1) {
      *(uint8_t **)relocationExecutableTarget = unwindInfoZonePointer;
    }
    relocationTargetAddress = relativeValue;
  }
  unwindInfoZoneExecutablePointer = codeExecutablePointer_local + ehFrameOffset;
  ehFrameZonePointer = (uint8_t *)(objectFileHeaderOffset + ehFrameOffset);
  memcpy(unwindInfoZoneExecutablePointer,*(void **)(codeWriteablePointer_local + 0x140),
         *(size_t *)(codeWriteablePointer_local + 0x130));
  ehFrameZoneExecutablePointer = codeExecutablePointer_local + debugLineOffset;
  debugLineZonePointer = (uint8_t *)(objectFileHeaderOffset + debugLineOffset);
  memcpy(ehFrameZoneExecutablePointer,*(void **)(codeWriteablePointer_local + 0x180),
         *(size_t *)(codeWriteablePointer_local + 0x170));
  sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo
            ((sysbvm_dwarf_debugInfo_builder_t *)(codeWriteablePointer_local + 0x220),
             (uintptr_t)constantZonePointer);
  debugLineExecutablePointer = (uint8_t *)(objectFileHeaderOffset + debugStrOffset);
  memcpy(codeExecutablePointer_local + debugStrOffset,*(void **)(codeWriteablePointer_local + 0x298)
         ,*(size_t *)(codeWriteablePointer_local + 0x288));
  debugStrExecutablePointer = (uint8_t *)(objectFileHeaderOffset + debugAbbrevOffset);
  memcpy(codeExecutablePointer_local + debugAbbrevOffset,
         *(void **)(codeWriteablePointer_local + 0x2b8),
         *(size_t *)(codeWriteablePointer_local + 0x2a8));
  debugAbbrevExecutablePointer = (uint8_t *)(objectFileHeaderOffset + debugInfoOffset);
  memcpy(codeExecutablePointer_local + debugInfoOffset,
         *(void **)(codeWriteablePointer_local + 0x2d8),
         *(size_t *)(codeWriteablePointer_local + 0x2c8));
  debugInfoExecutablePointer = (uint8_t *)(objectFileHeaderOffset + objectFileContentOffset);
  memcpy(codeExecutablePointer_local + objectFileContentOffset,
         *(void **)(codeWriteablePointer_local + 0x2f8),
         *(size_t *)(codeWriteablePointer_local + 0x2e8));
  __dest = codeExecutablePointer_local + (long)objectFileHeaderPointer;
  objectFileContentExecutablePointer_00 = objectFileHeaderPointer + objectFileHeaderOffset;
  memcpy(__dest,*(void **)(codeWriteablePointer_local + 0x358),
         *(size_t *)(codeWriteablePointer_local + 0x348));
  sysbvm_jit_fixupObjectFile
            ((sysbvm_bytecodeJit_t *)codeWriteablePointer_local,
             (sysbvm_elf64_header_t *)objectFileHeaderExecutablePointer,
             (sysbvm_elf64_header_t *)instructionsPointers,constantZonePointer,
             ehFrameZoneExecutablePointer,debugLineZonePointer,debugLineExecutablePointer,
             debugStrExecutablePointer,debugAbbrevExecutablePointer,debugInfoExecutablePointer,
             objectFileContentExecutablePointer_00,
             (sysbvm_jit_x64_elfContentFooter_t *)
             (__dest + *(long *)(codeWriteablePointer_local + 0x348) + -0x2e0));
  sysbvm_jit_emitPerfSymbolFor
            ((sysbvm_bytecodeJit_t *)codeWriteablePointer_local,instructionsExecutablePointers);
  if (*(long *)(codeWriteablePointer_local + 0x170) != 0) {
    sysbvm_dynarray_add((sysbvm_dynarray_t *)(*(long *)codeWriteablePointer_local + 0x22e8),
                        &debugLineZonePointer);
    __register_frame(debugLineZonePointer);
  }
  return constantZonePointer;
}

Assistant:

SYSBVM_API uint8_t *sysbvm_jit_installIn(sysbvm_bytecodeJit_t *jit, uint8_t *codeWriteablePointer, uint8_t *codeExecutablePointer)
{
    size_t objectFileHeaderOffset = 0;
    size_t codeOffset = sysbvm_sizeAlignedTo(jit->objectFileHeader.size, 16);
    size_t constantsOffset = codeOffset + sysbvm_sizeAlignedTo(jit->instructions.size, 16);

    size_t unwindInfoOffset = constantsOffset + sysbvm_sizeAlignedTo(jit->constants.size, 16);
    size_t ehFrameOffset = unwindInfoOffset + sysbvm_sizeAlignedTo(jit->unwindInfo.size, 16);
    size_t debugLineOffset = ehFrameOffset + sysbvm_sizeAlignedTo(jit->dwarfEhBuilder.buffer.size, 16);
    size_t debugStrOffset = debugLineOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.line.size, 16);
    size_t debugAbbrevOffset = debugStrOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.str.size, 16);
    size_t debugInfoOffset = debugAbbrevOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.abbrev.size, 16);

    size_t objectFileContentOffset = debugInfoOffset + sysbvm_sizeAlignedTo(jit->dwarfDebugInfoBuilder.info.size, 16);

    uint8_t *objectFileHeaderPointer = codeWriteablePointer + objectFileHeaderOffset;
    uint8_t *objectFileHeaderExecutablePointer = codeExecutablePointer + objectFileHeaderOffset;
    memcpy(objectFileHeaderPointer, jit->objectFileHeader.data, jit->objectFileHeader.size);

    uint8_t *instructionsPointers = codeWriteablePointer + codeOffset;
    uint8_t *instructionsExecutablePointers = codeExecutablePointer + codeOffset;
    memcpy(instructionsPointers, jit->instructions.data, jit->instructions.size);

    uint8_t *constantZonePointer = codeWriteablePointer + constantsOffset;
    uint8_t *constantZoneExecutablePointer = codeExecutablePointer + constantsOffset;
    memcpy(constantZonePointer, jit->constants.data, jit->constants.size);

    for(size_t i = 0; i < jit->relocations.size; ++i)
    {
        sysbvm_bytecodeJitRelocation_t *relocation = sysbvm_dynarray_entryOfTypeAt(jit->relocations, sysbvm_bytecodeJitRelocation_t, i);
        uint8_t *relocationTarget = instructionsPointers + relocation->offset;
        uint8_t *relocationExecutableTarget = instructionsExecutablePointers + relocation->offset;
        intptr_t relocationTargetAddress = (intptr_t)relocationExecutableTarget;

        intptr_t relativeValue = (intptr_t)constantZoneExecutablePointer + relocation->value - relocationTargetAddress + relocation->addend;
        switch(relocation->type)
        {
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE32:
            *((int32_t*)relocationTarget) = (int32_t)relativeValue;
            break;
        case SYSBVM_BYTECODE_JIT_RELOCATION_RELATIVE64:
            *((int64_t*)relocationTarget) = (int64_t)relativeValue;
            break;
        }
    }

    uint8_t *unwindInfoZonePointer = codeWriteablePointer + unwindInfoOffset;
    uint8_t *unwindInfoZoneExecutablePointer = codeExecutablePointer + unwindInfoOffset;
    memcpy(unwindInfoZonePointer, jit->unwindInfo.data, jit->unwindInfo.size);

    uint8_t *ehFrameZonePointer = codeWriteablePointer + ehFrameOffset;
    uint8_t *ehFrameZoneExecutablePointer = codeExecutablePointer + ehFrameOffset;
    memcpy(ehFrameZonePointer, jit->dwarfEhBuilder.buffer.data, jit->dwarfEhBuilder.buffer.size);

    sysbvm_dwarf_debugInfo_patchTextAddressesRelativeTo(&jit->dwarfDebugInfoBuilder, (uintptr_t)instructionsExecutablePointers);

    uint8_t *debugLineZonePointer = codeWriteablePointer + debugLineOffset;
    uint8_t *debugLineZoneExecutablePointer = codeExecutablePointer + debugLineOffset;
    memcpy(debugLineZonePointer, jit->dwarfDebugInfoBuilder.line.data, jit->dwarfDebugInfoBuilder.line.size);

    uint8_t *debugStrZonePointer = codeWriteablePointer + debugStrOffset;
    uint8_t *debugStrZoneExecutablePointer = codeExecutablePointer + debugStrOffset;
    memcpy(debugStrZonePointer, jit->dwarfDebugInfoBuilder.str.data, jit->dwarfDebugInfoBuilder.str.size);

    uint8_t *debugAbbrevZonePointer = codeWriteablePointer + debugAbbrevOffset;
    uint8_t *debugAbbrevZoneExecutablePointer = codeExecutablePointer + debugAbbrevOffset;
    memcpy(debugAbbrevZonePointer, jit->dwarfDebugInfoBuilder.abbrev.data, jit->dwarfDebugInfoBuilder.abbrev.size);

    uint8_t *debugInfoZonePointer = codeWriteablePointer + debugInfoOffset;
    uint8_t *debugInfoZoneExecutablePointer = codeExecutablePointer + debugInfoOffset;
    memcpy(debugInfoZonePointer, jit->dwarfDebugInfoBuilder.info.data, jit->dwarfDebugInfoBuilder.info.size);

    uint8_t *objectFileContentPointer = codeWriteablePointer + objectFileContentOffset;
    uint8_t *objectFileContentExecutablePointer = codeExecutablePointer + objectFileContentOffset;
    memcpy(objectFileContentPointer, jit->objectFileContent.data, jit->objectFileContent.size);

    sysbvm_jit_fixupObjectFile(jit,
        (sysbvm_elf64_header_t*)objectFileHeaderPointer,
        (sysbvm_elf64_header_t*)objectFileHeaderExecutablePointer,
        instructionsExecutablePointers,
        ehFrameZonePointer, ehFrameZoneExecutablePointer,
        debugLineZoneExecutablePointer,
        debugStrZoneExecutablePointer,
        debugAbbrevZoneExecutablePointer,
        debugInfoZoneExecutablePointer,
        objectFileContentExecutablePointer,
        (sysbvm_jit_x64_elfContentFooter_t*) (objectFileContentPointer + jit->objectFileContent.size - sizeof(sysbvm_jit_x64_elfContentFooter_t))
    );

    sysbvm_jit_emitPerfSymbolFor(jit, instructionsPointers);

#ifdef _WIN32
    RUNTIME_FUNCTION *runtimeFunction = (RUNTIME_FUNCTION*)unwindInfoZoneExecutablePointer;
    runtimeFunction->UnwindInfoAddress = (DWORD)(sizeof(RUNTIME_FUNCTION) + unwindInfoZoneExecutablePointer - instructionsExecutablePointers);
    if(RtlAddFunctionTable(runtimeFunction, 1, (DWORD64)(uintptr_t)instructionsExecutablePointers))
    {
        // Store the handle in the context for cleanup.
    }
#else
    (void)unwindInfoZoneExecutablePointer;
    if(jit->dwarfEhBuilder.buffer.size > 0)
    {
#   ifdef __APPLE__
        // It takes the FDE parameter
        if(jit->dwarfEhBuilder.fdeOffset > 0)
        {
            void *fdePointer = ehFrameZoneExecutablePointer + jit->dwarfEhBuilder.fdeOffset;
            sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &fdePointer);
            __register_frame(fdePointer);
        }
#   else
        // Send the eh_frame section.
        sysbvm_dynarray_add(&jit->context->jittedRegisteredFrames, &ehFrameZoneExecutablePointer);
        __register_frame(ehFrameZoneExecutablePointer);
#   endif
    }
#endif

    return instructionsExecutablePointers;
}